

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_iterator.hpp
# Opt level: O0

intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
* __thiscall
burst::
make_intersect_iterator<std::initializer_list<int>,std::initializer_list<int>,std::initializer_list<int>>
          (intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
           *__return_storage_ptr__,burst *this,
          tuple<std::initializer_list<int>_&,_std::initializer_list<int>_&,_std::initializer_list<int>_&>
          *ranges)

{
  tuple<std::initializer_list<int>_&,_std::initializer_list<int>_&,_std::initializer_list<int>_&>
  *in_RCX;
  iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>_>
  *ranges_00;
  vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>
  local_90;
  iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>_>
  local_78;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  make_range_vector_t local_30 [8];
  tuple<std::initializer_list<int>_&,_std::initializer_list<int>_&,_std::initializer_list<int>_&>
  common_ranges;
  tuple<std::initializer_list<int>_&,_std::initializer_list<int>_&,_std::initializer_list<int>_&>
  *ranges_local;
  
  local_38 = *(undefined8 *)(this + 0x10);
  local_48 = *(undefined8 *)this;
  uStack_40 = *(undefined8 *)(this + 8);
  common_ranges.
  super__Tuple_impl<0UL,_std::initializer_list<int>_&,_std::initializer_list<int>_&,_std::initializer_list<int>_&>
  .super__Head_base<0UL,_std::initializer_list<int>_&,_false>._M_head_impl =
       (initializer_list<int> *)this;
  detail::
  uniform_range_tuple_please<std::initializer_list<int>,std::initializer_list<int>,std::initializer_list<int>>
            ((tuple<std::initializer_list<int>_&,_std::initializer_list<int>_&,_std::initializer_list<int>_&>
              *)local_30,(detail *)&local_48,ranges);
  apply<burst::make_range_vector_t_const&,std::tuple<std::initializer_list<int>&,std::initializer_list<int>&,std::initializer_list<int>&>&>
            (&local_90,(burst *)&make_range_vector,local_30,in_RCX);
  own_as_range_t::operator()(&local_78,(own_as_range_t *)&own_as_range,&local_90);
  make_intersect_iterator<boost::iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>>>
            (__return_storage_ptr__,(burst *)&local_78,ranges_00);
  boost::
  iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>_>
  ::~iterator_range(&local_78);
  std::
  vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>::
  ~vector(&local_90);
  return __return_storage_ptr__;
}

Assistant:

auto make_intersect_iterator (std::tuple<Ranges &...> ranges)
    {
        auto common_ranges = detail::uniform_range_tuple_please(ranges);
        return
            make_intersect_iterator
            (
                burst::own_as_range(burst::apply(burst::make_range_vector, common_ranges))
            );
    }